

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_get_b32(uchar *r,secp256k1_fe *a)

{
  secp256k1_fe_verify(a);
  if (a->normalized != 0) {
    *r = *(uchar *)((long)a->n + 0x25);
    r[1] = *(uchar *)((long)a->n + 0x24);
    r[2] = *(uchar *)((long)a->n + 0x23);
    r[3] = *(uchar *)((long)a->n + 0x22);
    r[4] = *(uchar *)((long)a->n + 0x21);
    r[5] = (uchar)a->n[4];
    r[6] = (uchar)(a->n[3] >> 0x2c);
    r[7] = (uchar)(a->n[3] >> 0x24);
    r[8] = (uchar)(a->n[3] >> 0x1c);
    r[9] = (uchar)((uint)a->n[3] >> 0x14);
    r[10] = (uchar)((uint)a->n[3] >> 0xc);
    r[0xb] = (uchar)((uint)a->n[3] >> 4);
    r[0xc] = (byte)((int)a->n[3] << 4) | (byte)*(undefined2 *)((long)a->n + 0x16) & 0xf;
    r[0xd] = *(uchar *)((long)a->n + 0x15);
    r[0xe] = *(uchar *)((long)a->n + 0x14);
    r[0xf] = *(uchar *)((long)a->n + 0x13);
    r[0x10] = *(uchar *)((long)a->n + 0x12);
    r[0x11] = *(uchar *)((long)a->n + 0x11);
    r[0x12] = (uchar)a->n[2];
    r[0x13] = (uchar)(a->n[1] >> 0x2c);
    r[0x14] = (uchar)(a->n[1] >> 0x24);
    r[0x15] = (uchar)(a->n[1] >> 0x1c);
    r[0x16] = (uchar)((uint)a->n[1] >> 0x14);
    r[0x17] = (uchar)((uint)a->n[1] >> 0xc);
    r[0x18] = (uchar)((uint)a->n[1] >> 4);
    r[0x19] = (byte)((int)a->n[1] << 4) | (byte)*(undefined2 *)((long)a->n + 6) & 0xf;
    r[0x1a] = *(uchar *)((long)a->n + 5);
    r[0x1b] = *(uchar *)((long)a->n + 4);
    r[0x1c] = *(uchar *)((long)a->n + 3);
    r[0x1d] = *(uchar *)((long)a->n + 2);
    r[0x1e] = *(uchar *)((long)a->n + 1);
    r[0x1f] = (uchar)a->n[0];
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/field_impl.h"
          ,0x128,"test condition failed: a->normalized");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_get_b32(unsigned char *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(a->normalized);

    secp256k1_fe_impl_get_b32(r, a);
}